

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O2

void __thiscall Projector::DisplayCurrentSlice(Projector *this)

{
  allocator local_89;
  undefined4 local_88 [2];
  Mat *local_80;
  undefined8 local_78;
  undefined8 local_68;
  _InputArray local_60;
  Matx<double,_4,_1> local_48;
  
  std::__cxx11::string::string((string *)local_88,"Current Image",(allocator *)&local_60);
  cv::namedWindow((string *)local_88,0);
  std::__cxx11::string::~string((string *)local_88);
  local_78 = 0;
  local_88[0] = 0x3010000;
  local_68 = 0x1e0000001e;
  local_80 = &this->CurrentImage;
  cv::Matx<double,_4,_1>::Matx(&local_48);
  local_48.val[0] = 255.0;
  local_48.val[1] = 255.0;
  local_48.val[2] = 255.0;
  local_48.val[3] = 0.0;
  cv::putText(0,local_88,&this->CurrentImageLoc,&local_68,5,&local_48,1,8,0);
  std::__cxx11::string::string((string *)local_88,"Current Image",&local_89);
  local_60.sz.width = 0;
  local_60.sz.height = 0;
  local_60.flags = 0x1010000;
  local_60.obj = &this->CurrentImage;
  cv::imshow((string *)local_88,&local_60);
  std::__cxx11::string::~string((string *)local_88);
  cv::waitKey(20000);
  return;
}

Assistant:

void Projector::DisplayCurrentSlice()
{
	//Displays the current image on an openCV window

	namedWindow("Current Image", WINDOW_NORMAL);
	cv::Point pt = Point(0,0);
	putText(CurrentImage, CurrentImageLoc, Point(30,30), FONT_HERSHEY_COMPLEX_SMALL, 2, Scalar(255, 255, 255), 1, 8, false);
	imshow("Current Image", CurrentImage);
	waitKey(20000);

}